

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadContributorInfo(ColladaParser *this)

{
  int iVar1;
  undefined4 extraout_var;
  string local_38;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if (((char)iVar1 == '\0') &&
     (iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (char)iVar1 != '\0')) {
    do {
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar1 == 1) {
        ReadMetaDataItem(this,&this->mAssetMetaData);
      }
      else {
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar1 == 2) {
          iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"contributor");
          if (iVar1 == 0) {
            return;
          }
          local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_38,"Expected end of <contributor> element.","");
          ThrowException(this,&local_38);
        }
      }
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar1 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadContributorInfo()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            ReadMetaDataItem(mAssetMetaData);
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "contributor") != 0)
                ThrowException("Expected end of <contributor> element.");
            break;
        }
    }
}